

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hostkey.c
# Opt level: O3

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  char *pcVar2;
  char *src;
  size_t src_len;
  char *expected_hostkey;
  size_t expected_len;
  int type;
  size_t len;
  char *local_30;
  size_t local_28;
  int local_1c;
  size_t local_18;
  
  local_28 = 0;
  local_30 = (char *)0x0;
  pcVar2 = libssh2_session_hostkey(session,&local_18,&local_1c);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "libssh2_session_hostkey";
  }
  else {
    if (local_1c == 1) {
      src = 
      "AAAAB3NzaC1yc2EAAAABIwAAAQEArrr/JuJmaZligyfS8vcNur+mWR2ddDQtVdhHzdKUUoR6/Om6cvxpe61H1YZO1xCpLUBXmkki4HoNtYOpPB2W4V+8U4BDeVBD5crypEOE1+7BAm99fnEDxYIOZq2/jTP0yQmzCpWYS3COyFmkOL7sfX1wQMeW5zQT2WKcxC6FSWbhDqrBeNEGi687hJJoJ7YXgY/IdiYW5NcOuqRSWljjGS3dAJsHHWk4nJbhjEDXbPaeduMAwQU9i6ELfP3r+q6wdu0P4jWaoo3De1aYxnToV/ldXykpipON4NPamsb6Ph2qlJQKypq7J4iQgkIIbCU1A31+4ExvcIVoxLQw/aTSbw=="
      ;
      src_len = 0x174;
    }
    else if (local_1c == 3) {
      src = 
      "AAAAE2VjZHNhLXNoYTItbmlzdHAyNTYAAAAIbmlzdHAyNTYAAABBBC+/syyeKJD9dC2ZH9Q7iJGReR4YM3rUCMsSynkyXojdfSClGCMY7JvWlt30ESjYvxoTfSRGx6WvaqYK/vPoYQ4="
      ;
      src_len = 0x8c;
    }
    else {
      if (local_1c != 6) {
        fprintf(_stderr,"Unexpected type of hostkey: %i\n");
        return 1;
      }
      src = "AAAAC3NzaC1lZDI1NTE5AAAAIIxtdyg2ZRXE70UwyPVUH3UyfDBV8GX5cPF636P6hjom";
      src_len = 0x44;
    }
    iVar1 = _libssh2_base64_decode(session,&local_30,&local_28,src,src_len);
    if (iVar1 == 0) {
      if (local_18 != local_28) {
        fprintf(_stderr,"Hostkey does not have the expected length %ld!=%ld\n");
        return 1;
      }
      iVar1 = bcmp(pcVar2,local_30,local_18);
      if (iVar1 != 0) {
        test_cold_1();
        return 1;
      }
      return 0;
    }
    pcVar2 = "_libssh2_base64_decode";
  }
  print_last_session_error(pcVar2);
  return 1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    size_t len;
    int type;
    size_t expected_len = 0;
    char *expected_hostkey = NULL;

    const char *hostkey = libssh2_session_hostkey(session, &len, &type);
    if(!hostkey) {
        print_last_session_error("libssh2_session_hostkey");
        return 1;
    }

    if(type == LIBSSH2_HOSTKEY_TYPE_ED25519) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_ED25519_HOSTKEY,
                                    strlen(EXPECTED_ED25519_HOSTKEY));
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_ECDSA_256) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_ECDSA_HOSTKEY,
                                    strlen(EXPECTED_ECDSA_HOSTKEY));
    }
    else if(type == LIBSSH2_HOSTKEY_TYPE_RSA) {
        rc = _libssh2_base64_decode(session, &expected_hostkey, &expected_len,
                                    EXPECTED_RSA_HOSTKEY,
                                    strlen(EXPECTED_RSA_HOSTKEY));
    }
    else {
        fprintf(stderr, "Unexpected type of hostkey: %i\n", type);
        return 1;
    }

    if(rc) {
        print_last_session_error("_libssh2_base64_decode");
        return 1;
    }

    if(len != expected_len) {
        fprintf(stderr, "Hostkey does not have the expected length %ld!=%ld\n",
                (unsigned long)len, (unsigned long)expected_len);
        return 1;
    }

    if(memcmp(hostkey, expected_hostkey, len) != 0) {
        fprintf(stderr, "Hostkeys do not match\n");
        return 1;
    }

    return 0;
}